

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm_fold.c
# Opt level: O0

void emit_fold(BuildCtx *ctx)

{
  FILE *__stream;
  int iVar1;
  int *piVar2;
  char *pcVar3;
  char *pcVar4;
  size_t sVar5;
  long in_RDI;
  char *q;
  char *p;
  FILE *fp;
  char *fname;
  char buf [256];
  BuildCtx *in_stack_00007ee0;
  FILE *local_118;
  undefined8 local_110;
  char local_108 [6];
  char local_102 [250];
  long local_8;
  
  local_110 = (char *)**(undefined8 **)(in_RDI + 0x20);
  if (local_110 == (char *)0x0) {
    fprintf(_stderr,"Error: missing input filename\n");
    exit(1);
  }
  local_8 = in_RDI;
  if ((*local_110 == '-') && (local_110[1] == '\0')) {
    local_118 = _stdin;
  }
  else {
    local_118 = fopen64(local_110,"r");
    pcVar3 = local_110;
    __stream = _stderr;
    if (local_118 == (FILE *)0x0) {
      piVar2 = __errno_location();
      pcVar4 = strerror(*piVar2);
      fprintf(__stream,"Error: cannot open input file \'%s\': %s\n",pcVar3,pcVar4);
      exit(1);
    }
  }
  fprintf(*(FILE **)(local_8 + 0x10),"/* This is a generated file. DO NOT EDIT! */\n\n");
  fprintf(*(FILE **)(local_8 + 0x10),"static const FoldFunc fold_func[] = {\n");
  lineno = 0;
  funcidx = 0;
  nkeys = 0;
  while( true ) {
    while( true ) {
      do {
        pcVar3 = fgets(local_108,0x100,local_118);
        if (pcVar3 == (char *)0x0) {
          fclose(local_118);
          fprintf(*(FILE **)(local_8 + 0x10),"\n};\n\n");
          makehash(in_stack_00007ee0);
          return;
        }
        lineno = lineno + 1;
        iVar1 = strncmp(local_108,"LJFOLD",6);
      } while (iVar1 != 0);
      pcVar4 = local_102;
      pcVar3 = strchr(pcVar4,0x29);
      if ((*pcVar4 != '(') || (pcVar3 == (char *)0x0)) break;
      *pcVar3 = '\0';
      foldrule(pcVar4 + 1);
    }
    if (((*pcVar4 != 'F') && (*pcVar4 != 'X')) || ((pcVar4[1] != '(' || (pcVar3 == (char *)0x0))))
    break;
    pcVar4 = pcVar4 + 2;
    *pcVar3 = '\0';
    if (funcidx != 0) {
      fprintf(*(FILE **)(local_8 + 0x10),",\n");
    }
    if (pcVar4[-2] == 'X') {
      fprintf(*(FILE **)(local_8 + 0x10),"  %s",pcVar4);
    }
    else {
      fprintf(*(FILE **)(local_8 + 0x10),"  fold_%s",pcVar4);
    }
    funcidx = funcidx + 1;
  }
  sVar5 = strlen(local_108);
  local_108[sVar5 - 1] = '\0';
  fprintf(_stderr,"Error: unknown fold definition tag %s%s at line %d\n","LJFOLD",pcVar4,
          (ulong)(uint)lineno);
  exit(1);
}

Assistant:

void emit_fold(BuildCtx *ctx)
{
  char buf[256];  /* We don't care about analyzing lines longer than that. */
  const char *fname = ctx->args[0];
  FILE *fp;

  if (fname == NULL) {
    fprintf(stderr, "Error: missing input filename\n");
    exit(1);
  }

  if (fname[0] == '-' && fname[1] == '\0') {
    fp = stdin;
  } else {
    fp = fopen(fname, "r");
    if (!fp) {
      fprintf(stderr, "Error: cannot open input file '%s': %s\n",
	      fname, strerror(errno));
      exit(1);
    }
  }

  fprintf(ctx->fp, "/* This is a generated file. DO NOT EDIT! */\n\n");
  fprintf(ctx->fp, "static const FoldFunc fold_func[] = {\n");

  lineno = 0;
  funcidx = 0;
  nkeys = 0;
  while (fgets(buf, sizeof(buf), fp) != NULL) {
    lineno++;
    /* The prefix must be at the start of a line, otherwise it's ignored. */
    if (!strncmp(buf, FOLDDEF_PREFIX, sizeof(FOLDDEF_PREFIX)-1)) {
      char *p = buf+sizeof(FOLDDEF_PREFIX)-1;
      char *q = strchr(p, ')');
      if (p[0] == '(' && q) {
	p++;
	*q = '\0';
	foldrule(p);
      } else if ((p[0] == 'F' || p[0] == 'X') && p[1] == '(' && q) {
	p += 2;
	*q = '\0';
	if (funcidx)
	  fprintf(ctx->fp, ",\n");
	if (p[-2] == 'X')
	  fprintf(ctx->fp, "  %s", p);
	else
	  fprintf(ctx->fp, "  fold_%s", p);
	funcidx++;
      } else {
	buf[strlen(buf)-1] = '\0';
	fprintf(stderr, "Error: unknown fold definition tag %s%s at line %d\n",
		FOLDDEF_PREFIX, p, lineno);
	exit(1);
      }
    }
  }
  fclose(fp);
  fprintf(ctx->fp, "\n};\n\n");

  makehash(ctx);
}